

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::OutputFile::~OutputFile(OutputFile *this)

{
  pointer puVar1;
  long *plVar2;
  void *pvVar3;
  Data *pDVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  OStream *unaff_retaddr;
  Int64 originalPosition;
  Lock lock;
  Lock *in_stack_ffffffffffffffb0;
  Mutex *in_stack_ffffffffffffffb8;
  Lock *in_stack_ffffffffffffffc0;
  Data *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *lineOffsets;
  
  (in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__OutputFile_0374b500;
  if ((in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    lineOffsets = in_RDI;
    IlmThread_2_5::Lock::Lock
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x38,0));
    pDVar4 = (Data *)(**(code **)(**(long **)((in_RDI->
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              )._M_impl.super__Vector_impl_data._M_finish[0x27] +
                                             0x28) + 0x18))();
    this_00 = pDVar4;
    if ((in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish[0x20] != 0) {
      puVar1 = (in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      plVar2 = *(long **)(puVar1[0x27] + 0x28);
      (**(code **)(*plVar2 + 0x20))(plVar2,puVar1[0x20]);
      anon_unknown_6::writeLineOffsets(unaff_retaddr,lineOffsets);
      plVar2 = *(long **)((in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          )._M_impl.super__Vector_impl_data._M_finish[0x27] + 0x28);
      (**(code **)(*plVar2 + 0x20))(plVar2,pDVar4);
    }
    IlmThread_2_5::Lock::~Lock(in_stack_ffffffffffffffb0);
    if (((((in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish[0x28] & 1) != 0) &&
        ((in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
         super__Vector_impl_data._M_finish[0x27] != 0)) &&
       (plVar2 = *(long **)((in_RDI->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_finish[0x27] + 0x28),
       plVar2 != (long *)0x0)) {
      (**(code **)(*plVar2 + 8))();
    }
    if ((((int)(in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish[0x26] == -1) &&
        ((in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
         super__Vector_impl_data._M_finish[0x27] != 0)) &&
       (pvVar3 = (void *)(in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                         ._M_impl.super__Vector_impl_data._M_finish[0x27], pvVar3 != (void *)0x0)) {
      operator_delete(pvVar3,0x38);
    }
    puVar1 = (in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar1 != (pointer)0x0) {
      Data::~Data(this_00);
      operator_delete(puVar1,0x148);
    }
  }
  GenericOutputFile::~GenericOutputFile((GenericOutputFile *)in_RDI);
  return;
}

Assistant:

OutputFile::~OutputFile ()
{
    if (_data)
    {
        {
            Lock lock(*_data->_streamData);
            Int64 originalPosition = _data->_streamData->os->tellp();

            if (_data->lineOffsetsPosition > 0)
            {
                try
                {
                    _data->_streamData->os->seekp (_data->lineOffsetsPosition);
                    writeLineOffsets (*_data->_streamData->os, _data->lineOffsets);

                    //
                    // Restore the original position.
                    //
                    _data->_streamData->os->seekp (originalPosition);
                }
                catch (...) //NOSONAR - suppress vulnerability reports from SonarCloud.
                {
                    //
                    // We cannot safely throw any exceptions from here.
                    // This destructor may have been called because the
                    // stack is currently being unwound for another
                    // exception.
                    //
                }
            }
        }

        if (_data->_deleteStream && _data->_streamData)
            delete _data->_streamData->os;

        if (_data->partNumber == -1 && _data->_streamData)
            delete _data->_streamData;

	delete _data;
    }

}